

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::CreateCompositeExtract
          (InterfaceVariableScalarReplacement *this,uint32_t type_id,uint32_t composite_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indexes,uint32_t *extra_first_index)

{
  IRContext *c;
  pointer puVar1;
  uint32_t res_id;
  Instruction *this_00;
  pointer puVar2;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  uint32_t local_ac;
  uint32_t local_a8 [8];
  Operand local_88;
  SmallVector<unsigned_int,_2UL> local_58;
  
  res_id = Pass::TakeNextId(&this->super_Pass);
  this_00 = (Instruction *)::operator_new(0x70);
  c = (this->super_Pass).context_;
  init_list._M_len = 1;
  init_list._M_array = &local_ac;
  local_ac = composite_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
  local_88.type = SPV_OPERAND_TYPE_ID;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)local_a8,
             &local_88,&local_58);
  Instruction::Instruction(this_00,c,OpCompositeExtract,type_id,res_id,(OperandList *)local_a8);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_a8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  if (extra_first_index != (uint32_t *)0x0) {
    local_a8[0] = *extra_first_index;
    init_list_00._M_len = 1;
    init_list_00._M_array = local_a8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_00);
    local_88.type = SPV_OPERAND_TYPE_LITERAL_INTEGER;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&this_00->operands_,&local_88);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  }
  puVar1 = (indexes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar2 = (indexes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    local_a8[0] = *puVar2;
    init_list_01._M_len = 1;
    init_list_01._M_array = local_a8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_01);
    local_88.type = SPV_OPERAND_TYPE_LITERAL_INTEGER;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&this_00->operands_,&local_88);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  }
  return this_00;
}

Assistant:

Instruction* InterfaceVariableScalarReplacement::CreateCompositeExtract(
    uint32_t type_id, uint32_t composite_id,
    const std::vector<uint32_t>& indexes, const uint32_t* extra_first_index) {
  uint32_t component_id = TakeNextId();
  Instruction* composite_extract = new Instruction(
      context(), spv::Op::OpCompositeExtract, type_id, component_id,
      std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {composite_id}}});
  if (extra_first_index) {
    composite_extract->AddOperand(
        {SPV_OPERAND_TYPE_LITERAL_INTEGER, {*extra_first_index}});
  }
  for (uint32_t index : indexes) {
    composite_extract->AddOperand({SPV_OPERAND_TYPE_LITERAL_INTEGER, {index}});
  }
  return composite_extract;
}